

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void checkShaderError(GLuint shader)

{
  ostream *poVar1;
  char *pcVar2;
  ulong uVar3;
  GLchar *log;
  int local_10;
  GLint logSize;
  GLint success;
  GLuint shader_local;
  
  local_10 = 0;
  logSize = shader;
  (*__glewGetShaderiv)(shader,0x8b81,&local_10);
  if (local_10 == 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Shader Compile Failed.");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    log._4_4_ = 0;
    (*__glewGetShaderiv)(logSize,0x8b84,(long)&log + 4);
    if (log._4_4_ == 0) {
      poVar1 = std::operator<<((ostream *)&std::cout,"No log found.");
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    }
    else {
      uVar3 = (ulong)log._4_4_;
      if ((long)uVar3 < 0) {
        uVar3 = 0xffffffffffffffff;
      }
      pcVar2 = (char *)operator_new__(uVar3);
      (*__glewGetShaderInfoLog)(logSize,log._4_4_,(long)&log + 4,pcVar2);
      poVar1 = std::operator<<((ostream *)&std::cout,pcVar2);
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
      if (pcVar2 != (char *)0x0) {
        operator_delete__(pcVar2);
      }
    }
  }
  return;
}

Assistant:

void checkShaderError(GLuint shader) {
    GLint success = 0;
    glGetShaderiv(shader, GL_COMPILE_STATUS, &success);
    if (success) return;

    cout << "Shader Compile Failed." << endl;

    GLint logSize = 0;
    glGetShaderiv(shader, GL_INFO_LOG_LENGTH, &logSize);
    if (logSize == 0) {
        cout << "No log found." << endl;
        return;
    }

    GLchar *log = new GLchar[logSize];

    glGetShaderInfoLog(shader, logSize, &logSize, log);

    cout << log << endl;

    delete[] log;
}